

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast_helpers.hpp
# Opt level: O0

void duckdb::IntervalToStringCast::FormatIntervalValue
               (int32_t value,char *buffer,idx_t *length,char *name,idx_t name_len)

{
  long lVar1;
  void *in_RCX;
  long *in_RDX;
  idx_t *in_RSI;
  int in_EDI;
  size_t in_R8;
  undefined4 in_stack_fffffffffffffff8;
  
  if (in_EDI != 0) {
    if (*in_RDX != 0) {
      lVar1 = *in_RDX;
      *in_RDX = lVar1 + 1;
      *(undefined1 *)((long)in_RSI + lVar1) = 0x20;
    }
    FormatSignedNumber(name_len,(char *)CONCAT44(in_EDI,in_stack_fffffffffffffff8),in_RSI);
    memcpy((void *)((long)in_RSI + *in_RDX),in_RCX,in_R8);
    *in_RDX = in_R8 + *in_RDX;
    if ((in_EDI != 1) && (in_EDI != -1)) {
      lVar1 = *in_RDX;
      *in_RDX = lVar1 + 1;
      *(undefined1 *)((long)in_RSI + lVar1) = 0x73;
    }
  }
  return;
}

Assistant:

static void FormatIntervalValue(int32_t value, char buffer[], idx_t &length, const char *name, idx_t name_len) {
		if (value == 0) {
			return;
		}
		if (length != 0) {
			// space if there is already something in the buffer
			buffer[length++] = ' ';
		}
		FormatSignedNumber(value, buffer, length);
		// append the name together with a potential "s" (for plurals)
		memcpy(buffer + length, name, name_len);
		length += name_len;
		if (value != 1 && value != -1) {
			buffer[length++] = 's';
		}
	}